

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O2

realtype LBasisD2(ARKInterp I,int j,realtype t)

{
  double dVar1;
  uint uVar2;
  void *pvVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  pvVar3 = I->content;
  uVar2 = *(uint *)((long)pvVar3 + 0x18);
  lVar4 = (long)j;
  uVar5 = (ulong)(uint)j;
  uVar6 = 0;
  uVar7 = 0;
  if (0 < (int)uVar2) {
    uVar7 = (ulong)uVar2;
  }
  dVar10 = 0.0;
  for (; uVar6 != uVar7; uVar6 = uVar6 + 1) {
    if (uVar6 != uVar5) {
      dVar11 = 0.0;
      for (uVar8 = 0; uVar8 != uVar2; uVar8 = uVar8 + 1) {
        if (uVar8 != uVar6 && uVar8 != uVar5) {
          dVar12 = 1.0;
          for (uVar9 = 0; uVar2 != uVar9; uVar9 = uVar9 + 1) {
            if (((uVar6 != uVar9) && (uVar5 != uVar9)) && (uVar8 != uVar9)) {
              dVar1 = *(double *)(*(long *)((long)pvVar3 + 0x10) + uVar9 * 8);
              dVar12 = dVar12 * ((t - dVar1) /
                                (*(double *)(*(long *)((long)pvVar3 + 0x10) + lVar4 * 8) - dVar1));
            }
          }
          dVar11 = dVar11 + dVar12 / (*(double *)(*(long *)((long)pvVar3 + 0x10) + lVar4 * 8) -
                                     *(double *)(*(long *)((long)pvVar3 + 0x10) + uVar8 * 8));
        }
      }
      dVar10 = dVar10 + dVar11 / (*(double *)(*(long *)((long)pvVar3 + 0x10) + lVar4 * 8) -
                                 *(double *)(*(long *)((long)pvVar3 + 0x10) + uVar6 * 8));
    }
  }
  return dVar10;
}

Assistant:

realtype LBasisD2(ARKInterp I, int j, realtype t)
{
  int i, k, l;
  realtype p, q, r;
  p = ZERO;
  for (l=0; l<LINT_NHIST(I); l++) {
    if (l == j) continue;
    q = ZERO;
    for (i=0; i<LINT_NHIST(I); i++) {
      if (i == j) continue;
      if (i == l) continue;
      r = ONE;
      for (k=0; k<LINT_NHIST(I); k++) {
        if (k == j) continue;
        if (k == i) continue;
        if (k == l) continue;
        r *= (t-LINT_TJ(I,k))/(LINT_TJ(I,j)-LINT_TJ(I,k));
      }
      q += r/(LINT_TJ(I,j)-LINT_TJ(I,i));
    }
    p += q/(LINT_TJ(I,j)-LINT_TJ(I,l));
  }

  return(p);
}